

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Write(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Gia_Man_t *pGVar6;
  uint fVerbose;
  char *pcVar7;
  char *pcVar8;
  uint local_48;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  local_48 = 0;
  fVerbose = 0;
  do {
    iVar5 = Extra_UtilGetopt(argc,argv,"upmlnvh");
    switch(iVar5) {
    case 0x6c:
      bVar4 = (bool)(bVar4 ^ 1);
      break;
    case 0x6d:
      bVar3 = (bool)(bVar3 ^ 1);
      break;
    case 0x6e:
      local_48 = local_48 ^ 1;
      break;
    case 0x70:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x75:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x76:
      fVerbose = fVerbose ^ 1;
      break;
    default:
      if (iVar5 == -1) {
        if (argc - globalUtilOptind == 1) {
          pGVar6 = pAbc->pGia;
          if (pGVar6 != (Gia_Man_t *)0x0) {
            pcVar7 = argv[globalUtilOptind];
            if (bVar1) {
              pGVar6 = Gia_ManIsoCanonicize(pGVar6,fVerbose);
              Gia_AigerWriteSimple(pGVar6,pcVar7);
              Gia_ManStop(pGVar6);
            }
            else {
              if (bVar2) {
                Gia_ManDumpVerilog(pGVar6,pcVar7,(Vec_Int_t *)0x0);
                return 0;
              }
              if (bVar3) {
                Gia_ManWriteMiniAig(pGVar6,pcVar7);
              }
              else {
                if (!bVar4) {
                  Gia_AigerWrite(pGVar6,pcVar7,0,0,local_48);
                  return 0;
                }
                Gia_ManWriteMiniLut(pGVar6,pcVar7);
              }
            }
            return 0;
          }
          pcVar7 = "Abc_CommandAbc9Write(): There is no AIG to write.\n";
        }
        else {
          pcVar7 = "There is no file name.\n";
        }
        iVar5 = -1;
        goto LAB_00246018;
      }
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
      iVar5 = -2;
      Abc_Print(-2,"usage: &w [-upmlnvh] <file>\n");
      Abc_Print(-2,"\t         writes the current AIG into the AIGER file\n");
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (!bVar1) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-u     : toggle writing canonical AIG structure [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (!bVar2) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle writing Verilog with \'and\' and \'not\' [default = %s]\n",
                pcVar7);
      pcVar7 = "yes";
      if (!bVar3) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle writing MiniAIG rather than AIGER [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (!bVar4) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle writing MiniLUT rather than AIGER [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (local_48 == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,
                "\t-n     : toggle writing \'\\n\' after \'c\' in the AIGER file [default = %s]\n",
                pcVar7);
      if (fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar7 = "\t<file> : the file name\n";
LAB_00246018:
      Abc_Print(iVar5,pcVar7);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Write( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileName;
    char ** pArgvNew;
    int c, nArgcNew;
    int fUnique = 0;
    int fVerilog = 0;
    int fMiniAig = 0;
    int fMiniLut = 0;
    int fWriteNewLine = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "upmlnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'u':
            fUnique ^= 1;
            break;
        case 'p':
            fVerilog ^= 1;
            break;
        case 'm':
            fMiniAig ^= 1;
            break;
        case 'l':
            fMiniLut ^= 1;
            break;
        case 'n':
            fWriteNewLine ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Write(): There is no AIG to write.\n" );
        return 1;
    }
    pFileName = argv[globalUtilOptind];
    if ( fUnique )
    {
        Gia_Man_t * pGia = Gia_ManIsoCanonicize( pAbc->pGia, fVerbose );
        Gia_AigerWriteSimple( pGia, pFileName );
        Gia_ManStop( pGia );
    }
    else if ( fVerilog )
        Gia_ManDumpVerilog( pAbc->pGia, pFileName, NULL );
    else if ( fMiniAig )
        Gia_ManWriteMiniAig( pAbc->pGia, pFileName );
    else if ( fMiniLut )
        Gia_ManWriteMiniLut( pAbc->pGia, pFileName );
    else
        Gia_AigerWrite( pAbc->pGia, pFileName, 0, 0, fWriteNewLine );
    return 0;

usage:
    Abc_Print( -2, "usage: &w [-upmlnvh] <file>\n" );
    Abc_Print( -2, "\t         writes the current AIG into the AIGER file\n" );
    Abc_Print( -2, "\t-u     : toggle writing canonical AIG structure [default = %s]\n", fUnique? "yes" : "no" );
    Abc_Print( -2, "\t-p     : toggle writing Verilog with 'and' and 'not' [default = %s]\n", fVerilog? "yes" : "no" );
    Abc_Print( -2, "\t-m     : toggle writing MiniAIG rather than AIGER [default = %s]\n", fMiniAig? "yes" : "no" );
    Abc_Print( -2, "\t-l     : toggle writing MiniLUT rather than AIGER [default = %s]\n", fMiniLut? "yes" : "no" );
    Abc_Print( -2, "\t-n     : toggle writing \'\\n\' after \'c\' in the AIGER file [default = %s]\n", fWriteNewLine? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}